

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridLocalPolynomial.hpp
# Opt level: O0

unique_ptr<TasGrid::GridLocalPolynomial,_std::default_delete<TasGrid::GridLocalPolynomial>_>
__thiscall
TasGrid::GridReaderVersion5<TasGrid::GridLocalPolynomial>::read<TasGrid::IO::mode_ascii_type>
          (GridReaderVersion5<TasGrid::GridLocalPolynomial> *this,AccelerationContext *acc,
          istream *is)

{
  int iVar1;
  istream *piVar2;
  bool bVar3;
  int iVar4;
  erule eVar5;
  uint stride;
  uint uVar6;
  pointer pGVar7;
  size_type sVar8;
  reference pvVar9;
  uint *puVar10;
  unsigned_long num_entries;
  int in_R8D;
  int local_1e8;
  StorageSet local_188;
  vector<int,_std::allocator<int>_> local_160;
  vector<int,_std::allocator<int>_> local_148;
  vector<int,_std::allocator<int>_> local_130;
  allocator<int> local_111;
  vector<int,_std::allocator<int>_> local_110;
  size_type local_f8;
  size_t num_points;
  anon_class_8_1_898c3844 local_c8;
  int local_c0;
  int max_parents;
  Data2D<double> local_90;
  MultiIndexSet local_60;
  TypeOneDRule local_38;
  TypeOneDRule rule;
  undefined1 local_21;
  istream *local_20;
  istream *is_local;
  AccelerationContext *acc_local;
  unique_ptr<TasGrid::GridLocalPolynomial,_std::default_delete<TasGrid::GridLocalPolynomial>_> *grid
  ;
  
  local_21 = 0;
  local_20 = is;
  is_local = (istream *)acc;
  acc_local = (AccelerationContext *)this;
  Utils::make_unique<TasGrid::GridLocalPolynomial,TasGrid::AccelerationContext_const*&>
            ((Utils *)this,(AccelerationContext **)&is_local);
  iVar4 = IO::readNumber<TasGrid::IO::mode_ascii_type,int>(local_20);
  pGVar7 = ::std::
           unique_ptr<TasGrid::GridLocalPolynomial,_std::default_delete<TasGrid::GridLocalPolynomial>_>
           ::operator->((unique_ptr<TasGrid::GridLocalPolynomial,_std::default_delete<TasGrid::GridLocalPolynomial>_>
                         *)this);
  (pGVar7->super_BaseCanonicalGrid).num_dimensions = iVar4;
  iVar4 = IO::readNumber<TasGrid::IO::mode_ascii_type,int>(local_20);
  pGVar7 = ::std::
           unique_ptr<TasGrid::GridLocalPolynomial,_std::default_delete<TasGrid::GridLocalPolynomial>_>
           ::operator->((unique_ptr<TasGrid::GridLocalPolynomial,_std::default_delete<TasGrid::GridLocalPolynomial>_>
                         *)this);
  (pGVar7->super_BaseCanonicalGrid).num_outputs = iVar4;
  iVar4 = IO::readNumber<TasGrid::IO::mode_ascii_type,int>(local_20);
  pGVar7 = ::std::
           unique_ptr<TasGrid::GridLocalPolynomial,_std::default_delete<TasGrid::GridLocalPolynomial>_>
           ::operator->((unique_ptr<TasGrid::GridLocalPolynomial,_std::default_delete<TasGrid::GridLocalPolynomial>_>
                         *)this);
  pGVar7->order = iVar4;
  iVar4 = IO::readNumber<TasGrid::IO::mode_ascii_type,int>(local_20);
  pGVar7 = ::std::
           unique_ptr<TasGrid::GridLocalPolynomial,_std::default_delete<TasGrid::GridLocalPolynomial>_>
           ::operator->((unique_ptr<TasGrid::GridLocalPolynomial,_std::default_delete<TasGrid::GridLocalPolynomial>_>
                         *)this);
  pGVar7->top_level = iVar4;
  local_38 = IO::readRule<TasGrid::IO::mode_ascii_type>(local_20);
  pGVar7 = ::std::
           unique_ptr<TasGrid::GridLocalPolynomial,_std::default_delete<TasGrid::GridLocalPolynomial>_>
           ::operator->((unique_ptr<TasGrid::GridLocalPolynomial,_std::default_delete<TasGrid::GridLocalPolynomial>_>
                         *)this);
  eVar5 = RuleLocal::getEffectiveRule(pGVar7->order,local_38);
  pGVar7 = ::std::
           unique_ptr<TasGrid::GridLocalPolynomial,_std::default_delete<TasGrid::GridLocalPolynomial>_>
           ::operator->((unique_ptr<TasGrid::GridLocalPolynomial,_std::default_delete<TasGrid::GridLocalPolynomial>_>
                         *)this);
  num_entries = (unsigned_long)eVar5;
  pGVar7->effective_rule = eVar5;
  bVar3 = IO::readFlag<TasGrid::IO::mode_ascii_type>(local_20);
  if (bVar3) {
    MultiIndexSet::MultiIndexSet<TasGrid::IO::mode_ascii_type>(&local_60,local_20);
    pGVar7 = ::std::
             unique_ptr<TasGrid::GridLocalPolynomial,_std::default_delete<TasGrid::GridLocalPolynomial>_>
             ::operator->((unique_ptr<TasGrid::GridLocalPolynomial,_std::default_delete<TasGrid::GridLocalPolynomial>_>
                           *)this);
    MultiIndexSet::operator=(&(pGVar7->super_BaseCanonicalGrid).points,&local_60);
    MultiIndexSet::~MultiIndexSet(&local_60);
  }
  bVar3 = IO::readFlag<TasGrid::IO::mode_ascii_type>(local_20);
  piVar2 = local_20;
  if (bVar3) {
    pGVar7 = ::std::
             unique_ptr<TasGrid::GridLocalPolynomial,_std::default_delete<TasGrid::GridLocalPolynomial>_>
             ::operator->((unique_ptr<TasGrid::GridLocalPolynomial,_std::default_delete<TasGrid::GridLocalPolynomial>_>
                           *)this);
    uVar6 = (pGVar7->super_BaseCanonicalGrid).num_outputs;
    pGVar7 = ::std::
             unique_ptr<TasGrid::GridLocalPolynomial,_std::default_delete<TasGrid::GridLocalPolynomial>_>
             ::operator->((unique_ptr<TasGrid::GridLocalPolynomial,_std::default_delete<TasGrid::GridLocalPolynomial>_>
                           *)this);
    stride = MultiIndexSet::getNumIndexes(&(pGVar7->super_BaseCanonicalGrid).points);
    num_entries = (unsigned_long)stride;
    IO::readData2D<TasGrid::IO::mode_ascii_type,double,int,int>
              (&local_90,(IO *)piVar2,(istream *)(ulong)uVar6,stride,in_R8D);
    pGVar7 = ::std::
             unique_ptr<TasGrid::GridLocalPolynomial,_std::default_delete<TasGrid::GridLocalPolynomial>_>
             ::operator->((unique_ptr<TasGrid::GridLocalPolynomial,_std::default_delete<TasGrid::GridLocalPolynomial>_>
                           *)this);
    Data2D<double>::operator=(&pGVar7->surpluses,&local_90);
    Data2D<double>::~Data2D(&local_90);
  }
  bVar3 = IO::readFlag<TasGrid::IO::mode_ascii_type>(local_20);
  if (bVar3) {
    MultiIndexSet::MultiIndexSet<TasGrid::IO::mode_ascii_type>
              ((MultiIndexSet *)&max_parents,local_20);
    pGVar7 = ::std::
             unique_ptr<TasGrid::GridLocalPolynomial,_std::default_delete<TasGrid::GridLocalPolynomial>_>
             ::operator->((unique_ptr<TasGrid::GridLocalPolynomial,_std::default_delete<TasGrid::GridLocalPolynomial>_>
                           *)this);
    MultiIndexSet::operator=
              (&(pGVar7->super_BaseCanonicalGrid).needed,(MultiIndexSet *)&max_parents);
    MultiIndexSet::~MultiIndexSet((MultiIndexSet *)&max_parents);
  }
  local_c8.grid =
       (unique_ptr<TasGrid::GridLocalPolynomial,_std::default_delete<TasGrid::GridLocalPolynomial>_>
        *)this;
  local_c0 = read<TasGrid::IO::mode_ascii_type>::anon_class_8_1_898c3844::operator()(&local_c8);
  bVar3 = IO::readFlag<TasGrid::IO::mode_ascii_type>(local_20);
  piVar2 = local_20;
  iVar4 = local_c0;
  if (bVar3) {
    pGVar7 = ::std::
             unique_ptr<TasGrid::GridLocalPolynomial,_std::default_delete<TasGrid::GridLocalPolynomial>_>
             ::operator->((unique_ptr<TasGrid::GridLocalPolynomial,_std::default_delete<TasGrid::GridLocalPolynomial>_>
                           *)this);
    iVar1 = (pGVar7->super_BaseCanonicalGrid).num_dimensions;
    pGVar7 = ::std::
             unique_ptr<TasGrid::GridLocalPolynomial,_std::default_delete<TasGrid::GridLocalPolynomial>_>
             ::operator->((unique_ptr<TasGrid::GridLocalPolynomial,_std::default_delete<TasGrid::GridLocalPolynomial>_>
                           *)this);
    uVar6 = MultiIndexSet::getNumIndexes(&(pGVar7->super_BaseCanonicalGrid).points);
    num_entries = (unsigned_long)uVar6;
    IO::readData2D<TasGrid::IO::mode_ascii_type,int,int,int>
              ((Data2D<int> *)&num_points,(IO *)piVar2,(istream *)(ulong)(uint)(iVar4 * iVar1),uVar6
               ,in_R8D);
    pGVar7 = ::std::
             unique_ptr<TasGrid::GridLocalPolynomial,_std::default_delete<TasGrid::GridLocalPolynomial>_>
             ::operator->((unique_ptr<TasGrid::GridLocalPolynomial,_std::default_delete<TasGrid::GridLocalPolynomial>_>
                           *)this);
    Data2D<int>::operator=(&pGVar7->parents,(Data2D<int> *)&num_points);
    Data2D<int>::~Data2D((Data2D<int> *)&num_points);
  }
  pGVar7 = ::std::
           unique_ptr<TasGrid::GridLocalPolynomial,_std::default_delete<TasGrid::GridLocalPolynomial>_>
           ::operator->((unique_ptr<TasGrid::GridLocalPolynomial,_std::default_delete<TasGrid::GridLocalPolynomial>_>
                         *)this);
  bVar3 = MultiIndexSet::empty(&(pGVar7->super_BaseCanonicalGrid).points);
  if (bVar3) {
    pGVar7 = ::std::
             unique_ptr<TasGrid::GridLocalPolynomial,_std::default_delete<TasGrid::GridLocalPolynomial>_>
             ::operator->((unique_ptr<TasGrid::GridLocalPolynomial,_std::default_delete<TasGrid::GridLocalPolynomial>_>
                           *)this);
    local_1e8 = MultiIndexSet::getNumIndexes(&(pGVar7->super_BaseCanonicalGrid).needed);
  }
  else {
    pGVar7 = ::std::
             unique_ptr<TasGrid::GridLocalPolynomial,_std::default_delete<TasGrid::GridLocalPolynomial>_>
             ::operator->((unique_ptr<TasGrid::GridLocalPolynomial,_std::default_delete<TasGrid::GridLocalPolynomial>_>
                           *)this);
    local_1e8 = MultiIndexSet::getNumIndexes(&(pGVar7->super_BaseCanonicalGrid).points);
  }
  local_f8 = (size_type)local_1e8;
  iVar4 = IO::readNumber<TasGrid::IO::mode_ascii_type,int>(local_20);
  ::std::allocator<int>::allocator(&local_111);
  ::std::vector<int,_std::allocator<int>_>::vector(&local_110,(long)iVar4,&local_111);
  pGVar7 = ::std::
           unique_ptr<TasGrid::GridLocalPolynomial,_std::default_delete<TasGrid::GridLocalPolynomial>_>
           ::operator->((unique_ptr<TasGrid::GridLocalPolynomial,_std::default_delete<TasGrid::GridLocalPolynomial>_>
                         *)this);
  ::std::vector<int,_std::allocator<int>_>::operator=
            ((vector<int,_std::allocator<int>_> *)&pGVar7->roots,&local_110);
  ::std::vector<int,_std::allocator<int>_>::~vector(&local_110);
  ::std::allocator<int>::~allocator(&local_111);
  pGVar7 = ::std::
           unique_ptr<TasGrid::GridLocalPolynomial,_std::default_delete<TasGrid::GridLocalPolynomial>_>
           ::operator->((unique_ptr<TasGrid::GridLocalPolynomial,_std::default_delete<TasGrid::GridLocalPolynomial>_>
                         *)this);
  sVar8 = ::std::vector<int,_std::allocator<int>_>::size
                    ((vector<int,_std::allocator<int>_> *)&pGVar7->roots);
  piVar2 = local_20;
  if (sVar8 != 0) {
    pGVar7 = ::std::
             unique_ptr<TasGrid::GridLocalPolynomial,_std::default_delete<TasGrid::GridLocalPolynomial>_>
             ::operator->((unique_ptr<TasGrid::GridLocalPolynomial,_std::default_delete<TasGrid::GridLocalPolynomial>_>
                           *)this);
    IO::readVector<TasGrid::IO::mode_ascii_type,int>
              (piVar2,(vector<int,_std::allocator<int>_> *)&pGVar7->roots);
    IO::readVector<TasGrid::IO::mode_ascii_type,int,unsigned_long>
              (&local_130,(IO *)local_20,(istream *)(local_f8 + 1),num_entries);
    iVar4 = (int)num_entries;
    pGVar7 = ::std::
             unique_ptr<TasGrid::GridLocalPolynomial,_std::default_delete<TasGrid::GridLocalPolynomial>_>
             ::operator->((unique_ptr<TasGrid::GridLocalPolynomial,_std::default_delete<TasGrid::GridLocalPolynomial>_>
                           *)this);
    ::std::vector<int,_std::allocator<int>_>::operator=
              ((vector<int,_std::allocator<int>_> *)&pGVar7->pntr,&local_130);
    ::std::vector<int,_std::allocator<int>_>::~vector(&local_130);
    pGVar7 = ::std::
             unique_ptr<TasGrid::GridLocalPolynomial,_std::default_delete<TasGrid::GridLocalPolynomial>_>
             ::operator->((unique_ptr<TasGrid::GridLocalPolynomial,_std::default_delete<TasGrid::GridLocalPolynomial>_>
                           *)this);
    pvVar9 = ::std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)&pGVar7->pntr,local_f8);
    piVar2 = local_20;
    if (*pvVar9 < 1) {
      IO::readVector<TasGrid::IO::mode_ascii_type,int,int>
                (&local_160,(IO *)local_20,(istream *)0x1,iVar4);
      pGVar7 = ::std::
               unique_ptr<TasGrid::GridLocalPolynomial,_std::default_delete<TasGrid::GridLocalPolynomial>_>
               ::operator->((unique_ptr<TasGrid::GridLocalPolynomial,_std::default_delete<TasGrid::GridLocalPolynomial>_>
                             *)this);
      ::std::vector<int,_std::allocator<int>_>::operator=
                ((vector<int,_std::allocator<int>_> *)&pGVar7->indx,&local_160);
      ::std::vector<int,_std::allocator<int>_>::~vector(&local_160);
    }
    else {
      pGVar7 = ::std::
               unique_ptr<TasGrid::GridLocalPolynomial,_std::default_delete<TasGrid::GridLocalPolynomial>_>
               ::operator->((unique_ptr<TasGrid::GridLocalPolynomial,_std::default_delete<TasGrid::GridLocalPolynomial>_>
                             *)this);
      puVar10 = (uint *)::std::vector<int,_std::allocator<int>_>::operator[]
                                  ((vector<int,_std::allocator<int>_> *)&pGVar7->pntr,local_f8);
      IO::readVector<TasGrid::IO::mode_ascii_type,int,int>
                (&local_148,(IO *)piVar2,(istream *)(ulong)*puVar10,iVar4);
      pGVar7 = ::std::
               unique_ptr<TasGrid::GridLocalPolynomial,_std::default_delete<TasGrid::GridLocalPolynomial>_>
               ::operator->((unique_ptr<TasGrid::GridLocalPolynomial,_std::default_delete<TasGrid::GridLocalPolynomial>_>
                             *)this);
      ::std::vector<int,_std::allocator<int>_>::operator=
                ((vector<int,_std::allocator<int>_> *)&pGVar7->indx,&local_148);
      ::std::vector<int,_std::allocator<int>_>::~vector(&local_148);
    }
  }
  pGVar7 = ::std::
           unique_ptr<TasGrid::GridLocalPolynomial,_std::default_delete<TasGrid::GridLocalPolynomial>_>
           ::operator->((unique_ptr<TasGrid::GridLocalPolynomial,_std::default_delete<TasGrid::GridLocalPolynomial>_>
                         *)this);
  if (0 < (pGVar7->super_BaseCanonicalGrid).num_outputs) {
    StorageSet::StorageSet<TasGrid::IO::mode_ascii_type>(&local_188,local_20);
    pGVar7 = ::std::
             unique_ptr<TasGrid::GridLocalPolynomial,_std::default_delete<TasGrid::GridLocalPolynomial>_>
             ::operator->((unique_ptr<TasGrid::GridLocalPolynomial,_std::default_delete<TasGrid::GridLocalPolynomial>_>
                           *)this);
    StorageSet::operator=(&(pGVar7->super_BaseCanonicalGrid).values,&local_188);
    StorageSet::~StorageSet(&local_188);
  }
  return (__uniq_ptr_data<TasGrid::GridLocalPolynomial,_std::default_delete<TasGrid::GridLocalPolynomial>,_true,_true>
          )(__uniq_ptr_data<TasGrid::GridLocalPolynomial,_std::default_delete<TasGrid::GridLocalPolynomial>,_true,_true>
            )this;
}

Assistant:

static std::unique_ptr<GridLocalPolynomial> read(AccelerationContext const *acc, std::istream &is){
        std::unique_ptr<GridLocalPolynomial> grid = Utils::make_unique<GridLocalPolynomial>(acc);

            grid->num_dimensions = IO::readNumber<iomode, int>(is);
            grid->num_outputs = IO::readNumber<iomode, int>(is);
            grid->order = IO::readNumber<iomode, int>(is);
            grid->top_level = IO::readNumber<iomode, int>(is);
            TypeOneDRule rule = IO::readRule<iomode>(is);
            grid->effective_rule = RuleLocal::getEffectiveRule(grid->order, rule);

            if (IO::readFlag<iomode>(is)) grid->points = MultiIndexSet(is, iomode());
            if (std::is_same<iomode, IO::mode_ascii_type>::value){ // backwards compatible: surpluses and needed, or needed and surpluses
                if (IO::readFlag<iomode>(is))
                    grid->surpluses = IO::readData2D<iomode, double>(is, grid->num_outputs, grid->points.getNumIndexes());
                if (IO::readFlag<iomode>(is)) grid->needed = MultiIndexSet(is, iomode());
            }else{
                if (IO::readFlag<iomode>(is)) grid->needed = MultiIndexSet(is, iomode());
                if (IO::readFlag<iomode>(is))
                    grid->surpluses = IO::readData2D<iomode, double>(is, grid->num_outputs, grid->points.getNumIndexes());
            }
            int max_parents = [&]()->int {
                    switch(grid->effective_rule) {
                        case RuleLocal::erule::pwc: return RuleLocal::getMaxNumParents<RuleLocal::erule::pwc>();
                        case RuleLocal::erule::localp: return RuleLocal::getMaxNumParents<RuleLocal::erule::localp>();
                        case RuleLocal::erule::semilocalp: return RuleLocal::getMaxNumParents<RuleLocal::erule::semilocalp>();
                        case RuleLocal::erule::localp0: return RuleLocal::getMaxNumParents<RuleLocal::erule::localp0>();
                        default: // case RuleLocal::erule::localpb:
                            return RuleLocal::getMaxNumParents<RuleLocal::erule::localpb>();
                    };
                }();

            if (IO::readFlag<iomode>(is))
                grid->parents = IO::readData2D<iomode, int>(is, max_parents * grid->num_dimensions, grid->points.getNumIndexes());

            size_t num_points = (size_t) ((grid->points.empty()) ? grid->needed.getNumIndexes() : grid->points.getNumIndexes());
            grid->roots = std::vector<int>((size_t) IO::readNumber<iomode, int>(is));
            if (grid->roots.size() > 0){
                IO::readVector<iomode>(is, grid->roots);
                grid->pntr = IO::readVector<iomode, int>(is, num_points + 1);
                if (grid->pntr[num_points] > 0){
                    grid->indx = IO::readVector<iomode, int>(is, grid->pntr[num_points]);
                }else{
                    grid->indx = IO::readVector<iomode, int>(is, 1);
                }
            }

            if (grid->num_outputs > 0) grid->values = StorageSet(is, iomode());

        return grid;
    }